

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

EnumerantList * __thiscall
capnp::EnumSchema::getEnumerants(EnumerantList *__return_storage_ptr__,EnumSchema *this)

{
  RawBrandedSchema *pRVar1;
  Reader local_78;
  Reader local_48;
  
  pRVar1 = (this->super_Schema).raw;
  Schema::getProto(&local_48,&this->super_Schema);
  local_78._reader.dataSize = local_48._reader.dataSize;
  local_78._reader.pointerCount = local_48._reader.pointerCount;
  local_78._reader._38_2_ = local_48._reader._38_2_;
  local_78._reader.nestingLimit = local_48._reader.nestingLimit;
  local_78._reader._44_4_ = local_48._reader._44_4_;
  local_78._reader.data = local_48._reader.data;
  local_78._reader.pointers = local_48._reader.pointers;
  local_78._reader.segment = local_48._reader.segment;
  local_78._reader.capTable = local_48._reader.capTable;
  capnp::schema::Node::Enum::Reader::getEnumerants(&__return_storage_ptr__->list,&local_78);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

EnumSchema::EnumerantList EnumSchema::getEnumerants() const {
  return EnumerantList(*this, getProto().getEnum().getEnumerants());
}